

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

int ctl_lookup(tsdn_t *tsdn,ctl_named_node_t *starting_node,char *name,
              ctl_named_node_t **ending_nodep,size_t *mibp,size_t *depthp)

{
  size_t sVar1;
  char *__s;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  uintmax_t uVar6;
  ctl_named_node_t *pcVar7;
  ulong uVar8;
  ctl_node_t *pcVar9;
  size_t sVar10;
  
  pcVar3 = strchr(name,0x2e);
  if (pcVar3 == (char *)0x0) {
    sVar4 = strlen(name);
    pcVar3 = name + sVar4;
  }
  iVar2 = 2;
  sVar4 = (long)pcVar3 - (long)name;
  if (sVar4 != 0) {
    for (uVar8 = 0; pcVar7 = starting_node, uVar8 < *depthp; uVar8 = uVar8 + 1) {
      pcVar7 = (ctl_named_node_t *)starting_node->children;
      if ((pcVar7->node).named == true) {
        sVar1 = starting_node->nchildren;
        sVar10 = 0;
        while( true ) {
          if (sVar1 == sVar10) {
            return 2;
          }
          __s = pcVar7->name;
          sVar5 = strlen(__s);
          if ((sVar5 == sVar4) && (iVar2 = strncmp(name,__s,sVar4), iVar2 == 0)) break;
          sVar10 = sVar10 + 1;
          pcVar7 = pcVar7 + 1;
        }
        mibp[uVar8] = sVar10;
        if (pcVar7 == starting_node) {
          return 2;
        }
      }
      else {
        uVar6 = duckdb_je_malloc_strtoumax(name,(char **)0x0,10);
        if (uVar6 == 0xffffffffffffffff) {
          return 2;
        }
        pcVar9 = (ctl_node_t *)0x0;
        if (starting_node->children->named == false) {
          pcVar9 = starting_node->children;
        }
        pcVar7 = (ctl_named_node_t *)(**(code **)(pcVar9 + 8))(tsdn,mibp,*depthp,uVar6);
        if (pcVar7 == (ctl_named_node_t *)0x0) {
          return 2;
        }
        mibp[uVar8] = uVar6;
      }
      if (pcVar7->ctl !=
          (_func_int_tsd_t_ptr_size_t_ptr_size_t_void_ptr_size_t_ptr_void_ptr_size_t *)0x0) {
        if (*pcVar3 != '\0') {
          return 2;
        }
LAB_00e59e63:
        *depthp = uVar8 + 1;
        break;
      }
      if (*pcVar3 == '\0') goto LAB_00e59e63;
      name = pcVar3 + 1;
      pcVar3 = strchr(name,0x2e);
      if (pcVar3 == (char *)0x0) {
        sVar4 = strlen(name);
        pcVar3 = name + sVar4;
      }
      sVar4 = (long)pcVar3 - (long)name;
      starting_node = pcVar7;
    }
    iVar2 = 0;
    if (ending_nodep != (ctl_named_node_t **)0x0) {
      *ending_nodep = pcVar7;
    }
  }
  return iVar2;
}

Assistant:

static int
ctl_lookup(tsdn_t *tsdn, const ctl_named_node_t *starting_node,
    const char *name, const ctl_named_node_t **ending_nodep, size_t *mibp,
    size_t *depthp) {
	int ret;
	const char *elm, *tdot, *dot;
	size_t elen, i, j;
	const ctl_named_node_t *node;

	elm = name;
	/* Equivalent to strchrnul(). */
	dot = ((tdot = strchr(elm, '.')) != NULL) ? tdot : strchr(elm, '\0');
	elen = (size_t)((uintptr_t)dot - (uintptr_t)elm);
	if (elen == 0) {
		ret = ENOENT;
		goto label_return;
	}
	node = starting_node;
	for (i = 0; i < *depthp; i++) {
		assert(node);
		assert(node->nchildren > 0);
		if (ctl_named_node(node->children) != NULL) {
			const ctl_named_node_t *pnode = node;

			/* Children are named. */
			for (j = 0; j < node->nchildren; j++) {
				const ctl_named_node_t *child =
				    ctl_named_children(node, j);
				if (strlen(child->name) == elen &&
				    strncmp(elm, child->name, elen) == 0) {
					node = child;
					mibp[i] = j;
					break;
				}
			}
			if (node == pnode) {
				ret = ENOENT;
				goto label_return;
			}
		} else {
			uintmax_t index;
			const ctl_indexed_node_t *inode;

			/* Children are indexed. */
			index = malloc_strtoumax(elm, NULL, 10);
			if (index == UINTMAX_MAX || index > SIZE_T_MAX) {
				ret = ENOENT;
				goto label_return;
			}

			inode = ctl_indexed_node(node->children);
			node = inode->index(tsdn, mibp, *depthp, (size_t)index);
			if (node == NULL) {
				ret = ENOENT;
				goto label_return;
			}

			mibp[i] = (size_t)index;
		}

		/* Reached the end? */
		if (node->ctl != NULL || *dot == '\0') {
			/* Terminal node. */
			if (*dot != '\0') {
				/*
				 * The name contains more elements than are
				 * in this path through the tree.
				 */
				ret = ENOENT;
				goto label_return;
			}
			/* Complete lookup successful. */
			*depthp = i + 1;
			break;
		}

		/* Update elm. */
		elm = &dot[1];
		dot = ((tdot = strchr(elm, '.')) != NULL) ? tdot :
		    strchr(elm, '\0');
		elen = (size_t)((uintptr_t)dot - (uintptr_t)elm);
	}
	if (ending_nodep != NULL) {
		*ending_nodep = node;
	}

	ret = 0;
label_return:
	return ret;
}